

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

void adios2::utils::print_slice_info
               (VariableBase *variable,bool timed,uint64_t *s,uint64_t *c,Dims *count)

{
  undefined7 in_register_00000031;
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = CONCAT71(in_register_00000031,timed) & 0xffffffff;
  if ((int)CONCAT71(in_register_00000031,timed) == 0) {
    bVar5 = false;
  }
  else {
    bVar5 = *c < *(ulong *)(variable + 0xf8);
  }
  lVar2 = *(long *)(variable + 0x60) - *(long *)(variable + 0x58) >> 3;
  if (*(long *)(variable + 0x60) != *(long *)(variable + 0x58)) {
    lVar1 = 0;
    do {
      if (c[uVar3 + lVar1] <
          (count->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar1]) {
        bVar5 = true;
      }
      lVar1 = lVar1 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar1);
  }
  if (bVar5) {
    uVar3 = lVar2 + uVar3;
    fprintf(outf,"%c   slice (%lu:%lu",(ulong)(uint)(int)commentchar,*s,*s + *c + -1);
    if (1 < uVar3) {
      uVar4 = 1;
      do {
        fprintf(outf,", %lu:%lu",s[uVar4],s[uVar4] + c[uVar4] + -1);
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    fwrite(")\n",2,1,outf);
    return;
  }
  return;
}

Assistant:

void print_slice_info(core::VariableBase *variable, bool timed, uint64_t *s, uint64_t *c,
                      Dims count)
{
    // print the slice info in indexing is on and
    // not the complete variable is read
    size_t ndim = variable->m_Shape.size();
    size_t nsteps = variable->m_AvailableStepsCount;
    bool isaslice = false;
    int tidx = (timed ? 1 : 0);
    size_t tdim = ndim + tidx;
    if (timed)
    {
        if (c[0] < nsteps)
            isaslice = true;
    }
    for (size_t i = 0; i < ndim; i++)
    {
        if (c[i + tidx] < count[i])
            isaslice = true;
    }
    if (isaslice)
    {
        fprintf(outf, "%c   slice (%" PRIu64 ":%" PRIu64, commentchar, s[0], s[0] + c[0] - 1);
        for (size_t i = 1; i < tdim; i++)
        {
            fprintf(outf, ", %" PRIu64 ":%" PRIu64, s[i], s[i] + c[i] - 1);
        }
        fprintf(outf, ")\n");
    }
}